

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

int __thiscall PP_Expression::unary_expression(PP_Expression *this)

{
  qsizetype *pqVar1;
  long lVar2;
  Token TVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  uVar6 = 0;
  while( true ) {
    do {
      lVar2 = (this->super_Parser).index;
      TVar3 = NOTOKEN;
      if (lVar2 < (this->super_Parser).symbols.d.size) {
        (this->super_Parser).index = lVar2 + 1;
        TVar3 = (this->super_Parser).symbols.d.ptr[lVar2].token;
      }
    } while (TVar3 == PLUS);
    if (0x45 < (int)TVar3) break;
    if (TVar3 == MINUS) {
      iVar4 = unary_expression(this);
      uVar5 = -iVar4;
      goto LAB_0013fc6b;
    }
    if (TVar3 != PP_TILDE) goto LAB_0013fc60;
    uVar6 = ~uVar6;
  }
  if (TVar3 == NOT) {
    iVar4 = unary_expression(this);
    uVar5 = (uint)(iVar4 == 0);
    goto LAB_0013fc6b;
  }
  if (TVar3 == PP_MOC_TRUE) {
    uVar5 = 1;
    goto LAB_0013fc6b;
  }
  if (TVar3 == PP_MOC_FALSE) {
    uVar5 = 0;
    goto LAB_0013fc6b;
  }
LAB_0013fc60:
  pqVar1 = &(this->super_Parser).index;
  *pqVar1 = *pqVar1 + -1;
  uVar5 = primary_expression(this);
LAB_0013fc6b:
  return uVar6 ^ uVar5;
}

Assistant:

int PP_Expression::unary_expression()
{
    switch (next()) {
    case PP_PLUS:
        return unary_expression();
    case PP_MINUS:
        return -unary_expression();
    case PP_NOT:
        return !unary_expression();
    case PP_TILDE:
        return ~unary_expression();
    case PP_MOC_TRUE:
        return 1;
    case PP_MOC_FALSE:
        return 0;
    default:
        prev();
        return primary_expression();
    }
}